

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *v)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if ((v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<(os,"[");
    cppjieba::operator<<
              (poVar1,(v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                      _M_impl.super__Vector_impl_data._M_start);
    lVar2 = 0x30;
    for (uVar3 = 1;
        uVar3 < (ulong)(((long)(v->
                               super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(v->
                              super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                              _M_impl.super__Vector_impl_data._M_start) / 0x30); uVar3 = uVar3 + 1)
    {
      poVar1 = std::operator<<(os,", ");
      cppjieba::operator<<
                (poVar1,(Word *)((long)&(((v->
                                          super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->word).
                                        _M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + 0x30;
    }
    std::operator<<(os,"]");
    return os;
  }
  poVar1 = std::operator<<(os,"[]");
  return poVar1;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}